

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void Print<std::forward_list<int,std::allocator<int>>>(forward_list<int,_std::allocator<int>_> *d)

{
  ostream *poVar1;
  
  while (d = (forward_list<int,_std::allocator<int>_> *)((_Fwd_list_node_base *)d)->_M_next,
        (_Fwd_list_impl)d != (_Fwd_list_impl)0x0) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)((long)d + 8));
    std::operator<<(poVar1,",");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Print(T &d)
{
    for(auto &&e : d)
    {
        cout << e << ",";
    }

    cout << endl;
}